

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyagg_impl.h
# Opt level: O0

void secp256k1_keyagg_cache_save
               (secp256k1_musig_keyagg_cache *cache,secp256k1_keyagg_cache_internal *cache_i)

{
  uchar *in_RSI;
  undefined4 *in_RDI;
  uchar *ptr;
  secp256k1_ge *in_stack_00000028;
  uchar *in_stack_00000030;
  undefined4 *puVar1;
  secp256k1_ge *ge;
  
  *in_RDI = 0xdfbbadf4;
  puVar1 = in_RDI + 1;
  secp256k1_ge_to_bytes(in_stack_00000030,in_stack_00000028);
  ge = (secp256k1_ge *)(puVar1 + 0x10);
  secp256k1_ge_to_bytes_ext(in_RSI,ge);
  (ge->y).n[3] = *(uint64_t *)(in_RSI + 0xb0);
  (ge->y).n[4] = *(uint64_t *)(in_RSI + 0xb8);
  *(undefined8 *)&ge->infinity = *(undefined8 *)(in_RSI + 0xc0);
  ge[1].x.n[0] = *(uint64_t *)(in_RSI + 200);
  *(char *)(ge[1].x.n + 1) = (char)*(undefined4 *)(in_RSI + 0xf0);
  secp256k1_scalar_get_b32(in_RSI,(secp256k1_scalar *)((long)ge[1].x.n + 9));
  return;
}

Assistant:

static void secp256k1_keyagg_cache_save(secp256k1_musig_keyagg_cache *cache, const secp256k1_keyagg_cache_internal *cache_i) {
    unsigned char *ptr = cache->data;
    memcpy(ptr, secp256k1_musig_keyagg_cache_magic, 4);
    ptr += 4;
    secp256k1_ge_to_bytes(ptr, &cache_i->pk);
    ptr += 64;
    secp256k1_ge_to_bytes_ext(ptr, &cache_i->second_pk);
    ptr += 64;
    memcpy(ptr, cache_i->pks_hash, 32);
    ptr += 32;
    *ptr = cache_i->parity_acc;
    ptr += 1;
    secp256k1_scalar_get_b32(ptr, &cache_i->tweak);
}